

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

bool __thiscall
rsg::anon_unknown_0::IsReadableIntersectingEntry::operator()
          (IsReadableIntersectingEntry *this,ValueEntry *entry)

{
  bool bVar1;
  VariableType *this_00;
  VariableType *other;
  ConstValueRangeAccess local_50;
  ConstValueRangeAccess local_38;
  ValueEntry *local_20;
  ValueEntry *entry_local;
  IsReadableIntersectingEntry *this_local;
  
  local_20 = entry;
  entry_local = (ValueEntry *)this;
  bVar1 = IsReadableEntry::operator()(&this->super_IsReadableEntry,entry);
  if (bVar1) {
    ValueEntry::getValueRange(&local_38,local_20);
    this_00 = ConstValueRangeAccess::getType(&local_38);
    other = ConstValueRangeAccess::getType(&this->m_valueRange);
    bVar1 = VariableType::operator!=(this_00,other);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      ValueEntry::getValueRange(&local_50,local_20);
      bVar1 = ConstValueRangeAccess::intersects(&local_50,&this->m_valueRange);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator() (const ValueEntry* entry) const
	{
		if (!IsReadableEntry::operator()(entry))
			return false;

		if (entry->getValueRange().getType() != m_valueRange.getType())
			return false;

		if (!entry->getValueRange().intersects(m_valueRange))
			return false;

		return true;
	}